

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O1

int __thiscall
OpenMD::FluctuatingChargeConstraints::getNumberOfFlucQConstraints
          (FluctuatingChargeConstraints *this)

{
  Molecule *pMVar1;
  int iVar2;
  int iVar3;
  MoleculeIterator i;
  MoleculeIterator local_30;
  
  if (this->initialized_ == false) {
    if ((this->info_->usesFluctuatingCharges_ == true) &&
       (0 < this->info_->nGlobalFluctuatingCharges_)) {
      this->hasFlucQ_ = true;
    }
    this->initialized_ = true;
  }
  iVar2 = 0;
  if (this->hasFlucQ_ == true) {
    local_30._M_node = (_Base_ptr)0x0;
    pMVar1 = SimInfo::beginMolecule(this->info_,&local_30);
    iVar2 = 0;
    if (pMVar1 != (Molecule *)0x0) {
      iVar3 = 0;
      do {
        if (pMVar1->constrainTotalCharge_ == true) {
          iVar3 = iVar3 + 1;
        }
        else {
          if (this->constrainRegions_ == false) {
            iVar2 = 1;
          }
          if (pMVar1->molStamp_->region_ < 0) {
            iVar2 = 1;
          }
        }
        pMVar1 = SimInfo::nextMolecule(this->info_,&local_30);
      } while (pMVar1 != (Molecule *)0x0);
      iVar2 = iVar2 + iVar3;
    }
    iVar2 = (int)((ulong)((long)(this->regionCMom_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->regionCMom_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3) + iVar2;
  }
  return iVar2;
}

Assistant:

int FluctuatingChargeConstraints::getNumberOfFlucQConstraints() {
    int nConstraints = 0;
    if (!initialized_) initialize();
    if (!hasFlucQ_) return 0;
    SimInfo::MoleculeIterator i;
    Molecule* mol;
    int systemConstrain = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (mol->constrainTotalCharge()) {
        nConstraints++;
      } else {
        int region = mol->getRegion();
        if (!constrainRegions_ || region < 0) { systemConstrain = 1; }
      }
    }
    return nConstraints + regionCMom_.size() + systemConstrain;
  }